

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateZeroInitialize(ExpressionEvalContext *ctx,ExprZeroInitialize *expression)

{
  bool bVar1;
  TypeRef *pTVar2;
  ExprBase *pEVar3;
  ExprPointerLiteral *pEVar4;
  ExprPointerLiteral *ptr;
  TypeRef *refType;
  ExprZeroInitialize *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    pTVar2 = getType<TypeRef>(expression->address->type);
    if (pTVar2 == (TypeRef *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x6f9,
                    "ExprBase *EvaluateZeroInitialize(ExpressionEvalContext &, ExprZeroInitialize *)"
                   );
    }
    pEVar3 = Evaluate(ctx,expression->address);
    pEVar4 = getType<ExprPointerLiteral>(pEVar3);
    if (pEVar4 == (ExprPointerLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      if (pEVar4->ptr == (uchar *)0x0) {
        __assert_fail("ptr->ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x700,
                      "ExprBase *EvaluateZeroInitialize(ExpressionEvalContext &, ExprZeroInitialize *)"
                     );
      }
      if ((long)pEVar4->end - (long)pEVar4->ptr != (pTVar2->subType->size & 0xffffffffU)) {
        __assert_fail("uintptr_t(ptr->end - ptr->ptr) == unsigned(refType->subType->size)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x701,
                      "ExprBase *EvaluateZeroInitialize(ExpressionEvalContext &, ExprZeroInitialize *)"
                     );
      }
      memset(pEVar4->ptr,0,pTVar2->subType->size & 0xffffffff);
      pEVar3 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
      ExprVoid::ExprVoid((ExprVoid *)pEVar3,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
      ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEVar3);
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateZeroInitialize(ExpressionEvalContext &ctx, ExprZeroInitialize *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	TypeRef *refType = getType<TypeRef>(expression->address->type);

	assert(refType);

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(Evaluate(ctx, expression->address));

	if(!ptr)
		return NULL;

	assert(ptr->ptr);
	assert(uintptr_t(ptr->end - ptr->ptr) == unsigned(refType->subType->size));

	memset(ptr->ptr, 0, unsigned(refType->subType->size));

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}